

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O0

void anon_unknown.dwarf_2c0f7::buildUsage(int exitCode)

{
  FILE *__stream;
  char *pcVar1;
  raw_ostream *os;
  int optionWidth;
  int exitCode_local;
  
  __stream = _stderr;
  pcVar1 = llbuild::commands::getProgramName();
  fprintf(__stream,"Usage: %s buildsystem build [options] [<target>]\n",pcVar1);
  fprintf(_stderr,"\nOptions:\n");
  os = llvm::errs();
  llbuild::buildsystem::BuildSystemInvocation::getUsage(0x19,os);
  exit(exitCode);
}

Assistant:

static void buildUsage(int exitCode) {
  int optionWidth = 25;
  fprintf(stderr, "Usage: %s buildsystem build [options] [<target>]\n",
          getProgramName());
  fprintf(stderr, "\nOptions:\n");
  BuildSystemInvocation::getUsage(optionWidth, llvm::errs());
  ::exit(exitCode);
}